

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O1

int __thiscall Expr::MinimalHeaderSize(Expr *this,Env *env)

{
  CaseExpr *pCVar1;
  ID *pIVar2;
  bool bVar3;
  IDType IVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  LetField *f;
  Field *pFVar8;
  pointer ppCVar9;
  pointer ppEVar10;
  RecordField *pRVar11;
  _func_int **pp_Var12;
  undefined4 extraout_var;
  Type *pTVar13;
  Exception *this_00;
  ExceptionIDNotField *this_01;
  uint uVar14;
  ulong uVar15;
  int i;
  ulong uVar16;
  long lVar17;
  int local_64;
  Expr *local_60;
  ulong local_58;
  string local_50;
  
LAB_0011b03f:
  switch(this->expr_type_) {
  case EXPR_ID:
    pIVar2 = this->id_;
    IVar4 = Env::GetIDType(env,pIVar2);
    if (FUNC_PARAM < IVar4) {
      return -1;
    }
    if ((0x18U >> (IVar4 & 0x1f) & 1) == 0) {
      if (IVar4 != MACRO) {
        if ((0x347U >> (IVar4 & 0x1f) & 1) == 0) {
          return -1;
        }
LAB_0011b458:
        return 0;
      }
      this = Env::GetMacro(env,pIVar2);
    }
    else {
      pFVar8 = Env::GetField(env,pIVar2);
      if (pFVar8 == (Field *)0x0) {
        this_01 = (ExceptionIDNotField *)__cxa_allocate_exception(0x28);
        ExceptionIDNotField::ExceptionIDNotField(this_01,pIVar2);
        __cxa_throw(this_01,&ExceptionIDNotField::typeinfo,Exception::~Exception);
      }
      if (pFVar8->tof_ != LET_FIELD) {
        switch(pFVar8->tof_) {
        case CASE_FIELD:
          iVar7 = (*(pFVar8->type_->super_DataDepElement)._vptr_DataDepElement[0x13])
                            (pFVar8->type_,env);
          if (iVar7 < 0) {
            return -1;
          }
          return iVar7;
        default:
          return -1;
        case PADDING_FIELD:
        case RECORD_FIELD:
          uVar5 = *(uint *)((long)&pFVar8[1].super_Object.filename._M_string_length + 4);
          if ((int)uVar5 < 0) {
            return -1;
          }
          iVar7 = (*(pFVar8->super_DataDepElement)._vptr_DataDepElement[0xc])
                            (pFVar8,env,(ulong)uVar5);
          break;
        case PARAM_FIELD:
        case PARSE_VAR_FIELD:
        case PRIV_VAR_FIELD:
        case PUB_VAR_FIELD:
        case TEMP_VAR_FIELD:
          goto LAB_0011b458;
        }
        goto LAB_0011b2df;
      }
      this = *(Expr **)&pFVar8[1].super_DataDepElement.dde_type_;
    }
    goto LAB_0011b03f;
  case EXPR_NUM:
    return 0;
  case EXPR_SUBSCRIPT:
    pTVar13 = DataType(this->operand_[0],env);
    iVar7 = (*(pTVar13->super_DataDepElement)._vptr_DataDepElement[0xe])(pTVar13);
    iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x98))
                      ((long *)CONCAT44(extraout_var,iVar7),env);
    if (iVar7 < 0) {
      return -1;
    }
    bVar3 = ConstFold(this->operand_[1],env,&local_64);
    if (!bVar3) {
      return -1;
    }
    return iVar7 * local_64;
  case EXPR_MEMBER:
    goto switchD_0011b057_caseD_5;
  case EXPR_CALLARGS:
    if (this->args_ == (ExprList *)0x0) {
      return 0;
    }
    ppEVar10 = (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppEVar10) {
      return 0;
    }
    uVar5 = 0;
    uVar15 = 0;
    uVar16 = 1;
    do {
      uVar6 = MinimalHeaderSize(ppEVar10[uVar15],env);
      uVar14 = uVar6;
      if ((int)uVar6 < (int)uVar5) {
        uVar14 = uVar5;
      }
      uVar6 = uVar6 | uVar5;
      uVar5 = uVar14;
      if ((int)uVar6 < 0) {
        uVar5 = 0xffffffff;
      }
      ppEVar10 = (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      bVar3 = uVar16 < (ulong)((long)(this->args_->
                                     super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppEVar10 >> 3);
      uVar15 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar3);
    return uVar5;
  case EXPR_SIZEOF:
    pIVar2 = this->operand_[0]->id_;
    pRVar11 = anon_unknown.dwarf_9ab64::GetRecordField(pIVar2,env);
    if (pRVar11 == (RecordField *)0x0) {
      pTVar13 = TypeDecl::LookUpType(pIVar2);
      if (pTVar13 != (Type *)0x0) {
        return 0;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x20);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"not a record field or type","");
      Exception::Exception(this_00,&pIVar2->super_Object,&local_50);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    iVar7 = (*(pRVar11->super_Field).super_DataDepElement._vptr_DataDepElement[0xc])
                      (pRVar11,env,0xffffffff);
    if (-1 < iVar7) {
      return 0;
    }
    uVar5 = pRVar11->static_offset_;
    if ((int)uVar5 < 0) {
      return -1;
    }
    pp_Var12 = (pRVar11->super_Field).super_DataDepElement._vptr_DataDepElement;
    break;
  case EXPR_OFFSETOF:
    pRVar11 = anon_unknown.dwarf_9ab64::GetRecordField(this->operand_[0]->id_,env);
    if (-1 < pRVar11->static_offset_) {
      return pRVar11->static_offset_;
    }
    pRVar11 = pRVar11->prev_;
    uVar5 = pRVar11->static_offset_;
    if ((int)uVar5 < 0) {
      return -1;
    }
    pp_Var12 = (pRVar11->super_Field).super_DataDepElement._vptr_DataDepElement;
    break;
  default:
    if (this->expr_type_ == EXPR_CASE) {
      uVar5 = MinimalHeaderSize(this->operand_[0],env);
      ppCVar9 = (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
          super__Vector_impl_data._M_finish == ppCVar9) {
        return uVar5;
      }
      local_58 = 0;
      local_60 = this;
      do {
        pCVar1 = ppCVar9[local_58];
        if ((pCVar1->index_ != (ExprList *)0x0) &&
           (ppEVar10 = (pCVar1->index_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl
                       .super__Vector_impl_data._M_start,
           (pCVar1->index_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
           super__Vector_impl_data._M_finish != ppEVar10)) {
          uVar15 = 0;
          uVar16 = 1;
          do {
            uVar6 = MinimalHeaderSize(ppEVar10[uVar15],env);
            uVar14 = uVar6;
            if ((int)uVar6 < (int)uVar5) {
              uVar14 = uVar5;
            }
            uVar6 = uVar6 | uVar5;
            uVar5 = uVar14;
            if ((int)uVar6 < 0) {
              uVar5 = 0xffffffff;
            }
            ppEVar10 = (pCVar1->index_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl
                       .super__Vector_impl_data._M_start;
            bVar3 = uVar16 < (ulong)((long)(pCVar1->index_->
                                           super__Vector_base<Expr_*,_std::allocator<Expr_*>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppEVar10 >> 3);
            uVar15 = uVar16;
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (bVar3);
        }
        uVar6 = MinimalHeaderSize(pCVar1->value_,env);
        uVar14 = uVar6;
        if ((int)uVar6 < (int)uVar5) {
          uVar14 = uVar5;
        }
        uVar6 = uVar6 | uVar5;
        uVar5 = uVar14;
        if ((int)uVar6 < 0) {
          uVar5 = 0xffffffff;
        }
        local_58 = (ulong)((int)local_58 + 1);
        ppCVar9 = (local_60->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while (local_58 <
               (ulong)((long)(local_60->cases_->
                             super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)ppCVar9 >> 3));
      return uVar5;
    }
  case EXPR_CSTR:
  case EXPR_REGEX:
  case EXPR_PAREN:
  case EXPR_CALL:
    lVar17 = 0;
    uVar5 = 0;
    do {
      if (this->operand_[lVar17] != (Expr *)0x0) {
        uVar6 = MinimalHeaderSize(this->operand_[lVar17],env);
        uVar14 = uVar6;
        if ((int)uVar6 < (int)uVar5) {
          uVar14 = uVar5;
        }
        uVar6 = uVar6 | uVar5;
        uVar5 = uVar14;
        if ((int)uVar6 < 0) {
          uVar5 = 0xffffffff;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    return uVar5;
  }
  iVar7 = (*pp_Var12[0xc])(pRVar11,env,(ulong)uVar5);
LAB_0011b2df:
  if (iVar7 < 0) {
    return -1;
  }
  return uVar5 + iVar7;
switchD_0011b057_caseD_5:
  this = this->operand_[0];
  goto LAB_0011b03f;
}

Assistant:

int Expr::MinimalHeaderSize(Env* env)
	{
	int mhs;

	switch ( expr_type_ )
		{
		case EXPR_NUM:
			// Zero byte is required
			mhs = 0;
			break;

		case EXPR_ID:
			mhs = mhs_id(env, id_);
			break;

		case EXPR_MEMBER:
			// TODO: this is not a tight bound because
			// one actually does not have to parse the
			// whole record to compute one particular
			// field.
			mhs = operand_[0]->MinimalHeaderSize(env);
			break;

		case EXPR_SUBSCRIPT:
			{
			int index;
			Type* array_type = operand_[0]->DataType(env);
			Type* elem_type = array_type->ElementDataType();
			int elem_size = elem_type->StaticSize(env);
			if ( elem_size >= 0 && operand_[1]->ConstFold(env, &index) )
				{
				mhs = elem_size * index;
				}
			else
				{
				mhs = -1;
				}
			}
			break;

		case EXPR_SIZEOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* rf;
			Type* ty;

			if ( (rf = GetRecordField(id, env)) != nullptr )
				{
				if ( rf->StaticSize(env, -1) >= 0 )
					mhs = 0;
				else
					mhs = mhs_recordfield(env, rf);
				}

			else if ( (ty = TypeDecl::LookUpType(id)) != nullptr )
				{
				mhs = 0;
				}

			else
				throw Exception(id, "not a record field or type");
			}
			break;

		case EXPR_OFFSETOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* field = GetRecordField(id, env);

			mhs = field->static_offset();
			if ( mhs < 0 )
				{
				mhs = 0;
				// Take the MHS of the preceding (non-let) field
				RecordField* prev_field = field->prev();
				ASSERT(prev_field);
				mhs = mhs_recordfield(env, prev_field);
				}
			}
			break;

		case EXPR_CALLARGS:
			{
			mhs = 0;
			if ( args_ )
				for ( unsigned int i = 0; i < args_->size(); ++i )
					mhs = mhs_max(mhs, (*args_)[i]->MinimalHeaderSize(env));
			}
			break;
		case EXPR_CASE:
			{
			mhs = operand_[0]->MinimalHeaderSize(env);
			for ( unsigned int i = 0; i < cases_->size(); ++i )
				{
				CaseExpr* ce = (*cases_)[i];
				if ( ce->index() )
					for ( unsigned int j = 0; j < ce->index()->size(); ++j )
						mhs = mhs_max(mhs, (*ce->index())[j]->MinimalHeaderSize(env));
				mhs = mhs_max(mhs, ce->value()->MinimalHeaderSize(env));
				}
			}
			break;
		default:
			// Evaluate every operand by default
			mhs = 0;
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					mhs = mhs_max(mhs, operand_[i]->MinimalHeaderSize(env));
			break;
		}

	return mhs;
	}